

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_qnames(lysp_yang_ctx *ctx,ly_stmt parent_stmt,lysp_qname **qnames,yang_arg arg,
                   lysp_ext_instance **exts)

{
  ly_stmt stmt;
  LY_ERR LVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 in_register_0000000c;
  lysp_qname *plVar6;
  uint16_t *flags;
  ly_ctx *plVar7;
  uint64_t parent_stmt_index;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  ly_stmt local_54;
  char *local_50;
  size_t local_48;
  ly_stmt local_3c;
  char *local_38;
  
  plVar6 = *qnames;
  if (plVar6 == (lysp_qname *)0x0) {
    plVar2 = (long *)malloc(0x20);
    if (plVar2 == (long *)0x0) goto LAB_001721de;
    *plVar2 = 1;
    lVar3 = 1;
  }
  else {
    lVar3 = *(long *)&plVar6[-1].flags;
    *(long *)&plVar6[-1].flags = lVar3 + 1;
    plVar2 = (long *)realloc(&plVar6[-1].flags,lVar3 * 0x18 + 0x20);
    if (plVar2 == (long *)0x0) {
      *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + -1;
LAB_001721de:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_qnames");
      return LY_EMEM;
    }
    lVar3 = *plVar2;
  }
  *qnames = (lysp_qname *)(plVar2 + 1);
  flags = (uint16_t *)(plVar2 + lVar3 * 3);
  flags[-8] = 0;
  flags[-7] = 0;
  flags[-6] = 0;
  flags[-5] = 0;
  flags[-4] = 0;
  flags[-3] = 0;
  flags[-2] = 0;
  flags[-1] = 0;
  flags[0] = 0;
  flags[1] = 0;
  flags[2] = 0;
  flags[3] = 0;
  local_3c = parent_stmt;
  LVar1 = get_argument(ctx,Y_STR_ARG,flags,&local_50,&local_38,&local_48);
  if (LVar1 == LY_SUCCESS) {
    if (local_38 == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar4 = local_50;
      if (local_48 == 0) {
        pcVar4 = "";
      }
      LVar1 = lydict_insert(plVar7,pcVar4,local_48,(char **)(plVar2 + lVar3 * 3 + -2));
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar1 = lydict_insert_zc(plVar7,local_50,(char **)(plVar2 + lVar3 * 3 + -2));
    }
    if (LVar1 == LY_SUCCESS) {
      plVar2[lVar3 * 3 + -1] = (long)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
      ;
      LVar1 = get_keyword(ctx,&local_54,&local_50,&local_48);
      if ((LVar1 == LY_SUCCESS) && (LVar1 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_SEMICOLON)) {
        if (local_54 == LY_STMT_SYNTAX_LEFT_BRACE) {
          LVar1 = get_keyword(ctx,&local_54,&local_50,&local_48);
          stmt = local_3c;
          if ((LVar1 == LY_SUCCESS) && (LVar1 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_RIGHT_BRACE))
          {
            do {
              if (local_54 != LY_STMT_EXTENSION_INSTANCE) {
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar7 = (ly_ctx *)0x0;
                }
                else {
                  plVar7 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar4 = lyplg_ext_stmt2str(local_54);
                pcVar5 = lyplg_ext_stmt2str(stmt);
                ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar5);
                goto LAB_001723c8;
              }
              plVar6 = *qnames;
              if (plVar6 == (lysp_qname *)0x0) {
                plVar6 = (lysp_qname *)0x0;
                parent_stmt_index = 0xffffffffffffffff;
              }
              else {
                parent_stmt_index = *(long *)&plVar6[-1].flags - 1;
              }
              LVar1 = parse_ext(ctx,local_50,local_48,plVar6,stmt,parent_stmt_index,
                                (lysp_ext_instance **)CONCAT44(in_register_0000000c,arg));
            } while (((LVar1 == LY_SUCCESS) &&
                     (LVar1 = get_keyword(ctx,&local_54,&local_50,&local_48), LVar1 == LY_SUCCESS))
                    && (LVar1 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_RIGHT_BRACE));
          }
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          pcVar4 = lyplg_ext_stmt2str(local_54);
          ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
LAB_001723c8:
          LVar1 = LY_EVALID;
        }
      }
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
parse_qnames(struct lysp_yang_ctx *ctx, enum ly_stmt parent_stmt, struct lysp_qname **qnames, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    struct lysp_qname *item;
    size_t word_len;
    enum ly_stmt kw;

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *qnames, item, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, arg, &item->flags, &word, &buf, &word_len));

    INSERT_WORD_GOTO(ctx, buf, item->str, word, word_len, ret, cleanup);
    item->mod = PARSER_CUR_PMOD(ctx);
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, *qnames, parent_stmt, LY_ARRAY_COUNT(*qnames) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(parent_stmt));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}